

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# note.c
# Opt level: O0

nsync_note nsync_note_new(nsync_note parent,nsync_time abs_deadline)

{
  nsync_time a;
  nsync_time t;
  nsync_time a_00;
  int iVar1;
  uint32_t uVar2;
  nsync_note n_00;
  nsync_dll_list_ pnVar3;
  __time_t local_38;
  nsync_time parent_time;
  nsync_note n;
  nsync_note parent_local;
  nsync_time abs_deadline_local;
  
  n_00 = (nsync_note)malloc(0x70);
  if (n_00 != (nsync_note)0x0) {
    memset(n_00,0,0x70);
    nsync_dll_init_((nsync_dll_element_ *)n_00,n_00);
    set_expiry_time(n_00,abs_deadline);
    iVar1 = nsync_note_is_notified(n_00);
    if ((iVar1 == 0) && (parent != (nsync_note)0x0)) {
      nsync_mu_lock(&parent->note_mu);
      uVar2 = atm_load_acq_u32_(&parent->notified);
      if (uVar2 == 0) {
        if (parent->expiry_time_valid == 0) {
          local_38 = 0x7fffffffffffffff;
          parent_time.tv_sec = 999999999;
        }
        else {
          local_38 = (parent->expiry_time).tv_sec;
          parent_time.tv_sec = (parent->expiry_time).tv_nsec;
        }
      }
      else {
        local_38 = 0;
        parent_time.tv_sec = 0;
      }
      a.tv_nsec = parent_time.tv_sec;
      a.tv_sec = local_38;
      iVar1 = nsync_time_cmp(a,abs_deadline);
      if (iVar1 < 0) {
        t.tv_nsec = parent_time.tv_sec;
        t.tv_sec = local_38;
        set_expiry_time(n_00,t);
      }
      a_00.tv_nsec = parent_time.tv_sec;
      a_00.tv_sec = local_38;
      iVar1 = nsync_time_cmp(a_00,(nsync_time)ZEXT816((ulong)0));
      if (0 < iVar1) {
        n_00->parent = parent;
        pnVar3 = nsync_dll_make_last_in_list_(parent->children,(nsync_dll_element_ *)n_00);
        parent->children = pnVar3;
      }
      nsync_mu_unlock(&parent->note_mu);
    }
  }
  return n_00;
}

Assistant:

nsync_note nsync_note_new (nsync_note parent,
			   nsync_time abs_deadline) {
	nsync_note n = (nsync_note) malloc (sizeof (*n));
	if (n != NULL) {
		memset ((void *) n, 0, sizeof (*n));
		nsync_dll_init_ (&n->parent_child_link, n);
		set_expiry_time (n, abs_deadline);
		if (!nsync_note_is_notified (n) && parent != NULL) {
			nsync_time parent_time;
			nsync_mu_lock (&parent->note_mu);
			parent_time = NOTIFIED_TIME (parent);
			if (nsync_time_cmp (parent_time, abs_deadline) < 0) {
				set_expiry_time (n, parent_time);
			}
			if (nsync_time_cmp (parent_time, nsync_time_zero) > 0) {
				n->parent = parent;
				parent->children = nsync_dll_make_last_in_list_ (parent->children,
					&n->parent_child_link);
			}
			nsync_mu_unlock (&parent->note_mu);
		}
	}
	return (n);
}